

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AssignPointsToCorners
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          int num_connectivity_verts)

{
  CornerTable *pCVar1;
  pointer pAVar2;
  Mesh *pMVar3;
  bool bVar4;
  bool bVar5;
  CornerIndex corner;
  CornerIndex CVar6;
  int c;
  long lVar7;
  long lVar8;
  FaceIndex f_1;
  FaceIndex FVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  size_type __n;
  ulong uVar14;
  FaceIndex f;
  int iVar15;
  reference rVar16;
  Face face_1;
  vector<int,_std::allocator<int>_> point_to_corner_map;
  vector<int,_std::allocator<int>_> corner_to_point_map;
  
  pCVar1 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  FVar9.value_ = 0;
  Mesh::SetNumFaces((this->decoder_->super_MeshDecoder).mesh_,
                    (long)(int)((ulong)((long)*(pointer *)
                                               ((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8)
                                        - *(long *)&(pCVar1->corner_to_vertex_map_).vector_ >> 2) /
                               3));
  if ((this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar8 = 0;
    while( true ) {
      pMVar3 = (this->decoder_->super_MeshDecoder).mesh_;
      if ((uint)(((long)(pMVar3->faces_).vector_.
                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar3->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= FVar9.value_) break;
      point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pCVar1 = (this->corner_table_)._M_t.
               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        uVar12 = 0xffffffff;
        if ((int)(lVar7 + lVar8) != -1) {
          uVar12 = *(undefined4 *)
                    (*(long *)&(pCVar1->corner_to_vertex_map_).vector_ +
                    (lVar7 + lVar8 & 0xffffffffU) * 4);
        }
        *(undefined4 *)
         ((long)&point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7 * 4) = uVar12;
      }
      Mesh::SetFace(pMVar3,FVar9,(Face *)&point_to_corner_map);
      FVar9.value_ = FVar9.value_ + 1;
      lVar8 = lVar8 + 3;
    }
    ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ =
         num_connectivity_verts;
    bVar5 = true;
  }
  else {
    point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::vector<int,_std::allocator<int>_>::vector
              (&corner_to_point_map,
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8) -
                                  *(long *)&(pCVar1->corner_to_vertex_map_).vector_) >> 2),
               (allocator_type *)&face_1);
    __n = 0;
    while( true ) {
      pCVar1 = (this->corner_table_)._M_t.
               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
      lVar8 = *(long *)&(pCVar1->vertex_corners_).vector_.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ;
      lVar7 = (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar1->vertex_corners_).vector_ + 8) -
                                 lVar8) >> 2);
      bVar5 = lVar7 <= (long)__n;
      if (lVar7 <= (long)__n) break;
      CVar6.value_ = *(uint *)(lVar8 + __n * 4);
      uVar10 = (ulong)CVar6.value_;
      if (uVar10 != 0xffffffff) {
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_vert_hole_,__n);
        uVar11 = uVar10;
        corner.value_ = CVar6.value_;
        if ((*rVar16._M_p & rVar16._M_mask) == 0) {
          uVar13 = 0;
          while( true ) {
            uVar14 = (ulong)uVar13;
            pAVar2 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = uVar10;
            corner.value_ = CVar6.value_;
            if ((ulong)(((long)(this->attribute_data_).
                               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x140)
                <= uVar14) break;
            bVar4 = MeshAttributeCornerTable::IsCornerOnSeam
                              (&pAVar2[uVar14].connectivity_data,CVar6);
            if (bVar4) {
              iVar15 = *(int *)(*(long *)&(this->attribute_data_).
                                          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                          connectivity_data.corner_to_vertex_map_.
                                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                          ._M_impl + uVar10 * 4);
              for (corner = CornerTable::SwingRight
                                      ((this->corner_table_)._M_t.
                                       super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                       .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                       _M_head_impl,CVar6); corner.value_ != CVar6.value_;
                  corner = CornerTable::SwingRight
                                     ((this->corner_table_)._M_t.
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                      _M_head_impl,corner)) {
                if (corner.value_ == 0xffffffff) goto LAB_0011d6a3;
                uVar11 = (ulong)corner.value_;
                if (*(int *)(*(long *)&(this->attribute_data_).
                                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                       connectivity_data.corner_to_vertex_map_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl + (ulong)corner.value_ * 4) != iVar15)
                goto LAB_0011d4ad;
              }
            }
            uVar13 = uVar13 + 1;
          }
        }
LAB_0011d4ad:
        corner_to_point_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] =
             (int)((ulong)((long)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
        face_1._M_elems[0].value_ = corner.value_;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&point_to_corner_map,(int *)&face_1);
        CVar6 = CornerTable::SwingRight
                          ((this->corner_table_)._M_t.
                           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                           .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,corner);
        uVar10 = (ulong)corner.value_;
        while ((uVar11 = (ulong)CVar6.value_, CVar6.value_ != 0xffffffff &&
               (CVar6.value_ != corner.value_))) {
          pAVar2 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = 0;
          do {
            if ((ulong)(((long)(this->attribute_data_).
                               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x140)
                <= (ulong)uVar13) {
              corner_to_point_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] =
                   corner_to_point_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
              goto LAB_0011d570;
            }
            lVar8 = *(long *)&pAVar2[uVar13].connectivity_data.corner_to_vertex_map_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                              ._M_impl;
            uVar13 = uVar13 + 1;
          } while (*(int *)(lVar8 + uVar11 * 4) == *(int *)(lVar8 + uVar10 * 4));
          corner_to_point_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] =
               (int)((ulong)((long)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
          face_1._M_elems[0].value_ = CVar6.value_;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&point_to_corner_map,(int *)&face_1);
LAB_0011d570:
          CVar6 = CornerTable::SwingRight
                            ((this->corner_table_)._M_t.
                             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                             .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,CVar6)
          ;
          uVar10 = uVar11;
        }
      }
      __n = __n + 1;
    }
    iVar15 = 0;
    FVar9.value_ = 0;
    while( true ) {
      pMVar3 = (this->decoder_->super_MeshDecoder).mesh_;
      if ((uint)(((long)(pMVar3->faces_).vector_.
                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar3->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= FVar9.value_) break;
      face_1._M_elems[2].value_ = 0;
      face_1._M_elems[0].value_ = 0;
      face_1._M_elems[1].value_ = 0;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        face_1._M_elems[lVar8].value_ =
             corner_to_point_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)(iVar15 + (int)lVar8)];
      }
      Mesh::SetFace(pMVar3,FVar9,&face_1);
      FVar9.value_ = FVar9.value_ + 1;
      iVar15 = iVar15 + 3;
    }
    ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ =
         (ValueType)
         ((ulong)((long)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
LAB_0011d6a3:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&corner_to_point_map.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&point_to_corner_map.super__Vector_base<int,_std::allocator<int>_>);
  }
  return bVar5;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::AssignPointsToCorners(
    int num_connectivity_verts) {
  // Map between the existing and deduplicated point ids.
  // Note that at this point we have one point id for each corner of the
  // mesh so there is corner_table_->num_corners() point ids.
  decoder_->mesh()->SetNumFaces(corner_table_->num_faces());

  if (attribute_data_.empty()) {
    // We have connectivity for position only. In this case all vertex indices
    // are equal to point indices.
    for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
      Mesh::Face face;
      const CornerIndex start_corner(3 * f.value());
      for (int c = 0; c < 3; ++c) {
        // Get the vertex index on the corner and use it as a point index.
        const int32_t vert_id = corner_table_->Vertex(start_corner + c).value();
        face[c] = vert_id;
      }
      decoder_->mesh()->SetFace(f, face);
    }
    decoder_->point_cloud()->set_num_points(num_connectivity_verts);
    return true;
  }
  // Else we need to deduplicate multiple attributes.

  // Map between point id and an associated corner id. Only one corner for
  // each point is stored. The corners are used to sample the attribute values
  // in the last stage of the deduplication.
  std::vector<int32_t> point_to_corner_map;
  // Map between every corner and their new point ids.
  std::vector<int32_t> corner_to_point_map(corner_table_->num_corners());
  for (int v = 0; v < corner_table_->num_vertices(); ++v) {
    CornerIndex c = corner_table_->LeftMostCorner(VertexIndex(v));
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex.
    }
    CornerIndex deduplication_first_corner = c;
    if (is_vert_hole_[v]) {
      // If the vertex is on a boundary, start deduplication from the left most
      // corner that is guaranteed to lie on the boundary.
      deduplication_first_corner = c;
    } else {
      // If we are not on the boundary we need to find the first seam (of any
      // attribute).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (!attribute_data_[i].connectivity_data.IsCornerOnSeam(c)) {
          continue;  // No seam for this attribute, ignore it.
        }
        // Else there needs to be at least one seam edge.

        // At this point, we use identity mapping between corners and point ids.
        const VertexIndex vert_id =
            attribute_data_[i].connectivity_data.Vertex(c);
        CornerIndex act_c = corner_table_->SwingRight(c);
        bool seam_found = false;
        while (act_c != c) {
          if (act_c == kInvalidCornerIndex) {
            return false;
          }
          if (attribute_data_[i].connectivity_data.Vertex(act_c) != vert_id) {
            // Attribute seam found. Stop.
            deduplication_first_corner = act_c;
            seam_found = true;
            break;
          }
          act_c = corner_table_->SwingRight(act_c);
        }
        if (seam_found) {
          break;  // No reason to process other attributes if we found a seam.
        }
      }
    }

    // Do a deduplication pass over the corners on the processed vertex.
    // At this point each corner corresponds to one point id and our goal is to
    // merge similar points into a single point id.
    // We do a single pass in a clockwise direction over the corners and we add
    // a new point id whenever one of the attributes change.
    c = deduplication_first_corner;
    // Create a new point.
    corner_to_point_map[c.value()] =
        static_cast<uint32_t>(point_to_corner_map.size());
    point_to_corner_map.push_back(c.value());
    // Traverse in CW direction.
    CornerIndex prev_c = c;
    c = corner_table_->SwingRight(c);
    while (c != kInvalidCornerIndex && c != deduplication_first_corner) {
      bool attribute_seam = false;
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (attribute_data_[i].connectivity_data.Vertex(c) !=
            attribute_data_[i].connectivity_data.Vertex(prev_c)) {
          // Attribute index changed from the previous corner. We need to add a
          // new point here.
          attribute_seam = true;
          break;
        }
      }
      if (attribute_seam) {
        corner_to_point_map[c.value()] =
            static_cast<uint32_t>(point_to_corner_map.size());
        point_to_corner_map.push_back(c.value());
      } else {
        corner_to_point_map[c.value()] = corner_to_point_map[prev_c.value()];
      }
      prev_c = c;
      c = corner_table_->SwingRight(c);
    }
  }
  // Add faces.
  for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
    Mesh::Face face;
    for (int c = 0; c < 3; ++c) {
      // Remap old points to the new ones.
      face[c] = corner_to_point_map[3 * f.value() + c];
    }
    decoder_->mesh()->SetFace(f, face);
  }
  decoder_->point_cloud()->set_num_points(
      static_cast<uint32_t>(point_to_corner_map.size()));
  return true;
}